

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network_server.cpp
# Opt level: O0

int __thiscall CNetServer::Update(CNetServer *this)

{
  int iVar1;
  CNetServer *pCVar2;
  int64 iVar3;
  long lVar4;
  CNetBan *pCVar5;
  NETADDR *pNVar6;
  CNetServer *in_RDI;
  CNetTokenCache *unaff_retaddr;
  CNetConnection *in_stack_00000018;
  int i;
  int64 Now;
  int in_stack_ffffffffffffffbc;
  int in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  CNetBan *in_stack_ffffffffffffffc8;
  CNetServer *this_00;
  int local_14;
  
  pCVar2 = (CNetServer *)time_get();
  for (local_14 = 0; local_14 < 0x40; local_14 = local_14 + 1) {
    iVar1 = CNetConnection::State(&in_RDI->m_aSlots[local_14].m_Connection);
    if (iVar1 != 0) {
      CNetConnection::Update(in_stack_00000018);
      iVar1 = CNetConnection::State(&in_RDI->m_aSlots[local_14].m_Connection);
      if (iVar1 == 5) {
        this_00 = pCVar2;
        iVar3 = CNetConnection::ConnectTime(&in_RDI->m_aSlots[local_14].m_Connection);
        lVar4 = (long)this_00 - iVar3;
        iVar3 = time_freq();
        if ((lVar4 < iVar3) && (pCVar5 = NetBan(in_RDI), pCVar5 != (CNetBan *)0x0)) {
          in_stack_ffffffffffffffc8 = NetBan(in_RDI);
          pNVar6 = ClientAddr((CNetServer *)
                              CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                              in_stack_ffffffffffffffbc);
          iVar1 = (*in_stack_ffffffffffffffc8->_vptr_CNetBan[2])
                            (in_stack_ffffffffffffffc8,pNVar6,0x3c,"Stressing network");
          if (iVar1 == -1) {
            in_stack_ffffffffffffffc4 = local_14;
            CNetConnection::ErrorString(&in_RDI->m_aSlots[local_14].m_Connection);
            Drop(this_00,(int)((ulong)in_stack_ffffffffffffffc8 >> 0x20),
                 (char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
          }
        }
        else {
          in_stack_ffffffffffffffc0 = local_14;
          CNetConnection::ErrorString(&in_RDI->m_aSlots[local_14].m_Connection);
          Drop(this_00,(int)((ulong)in_stack_ffffffffffffffc8 >> 0x20),
               (char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
        }
      }
    }
  }
  CNetTokenManager::Update
            ((CNetTokenManager *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  CNetTokenCache::Update(unaff_retaddr);
  return 0;
}

Assistant:

int CNetServer::Update()
{
	int64 Now = time_get();
	for(int i = 0; i < NET_MAX_CLIENTS; i++)
	{
		if(m_aSlots[i].m_Connection.State() == NET_CONNSTATE_OFFLINE)
			continue;

		m_aSlots[i].m_Connection.Update();
		if(m_aSlots[i].m_Connection.State() == NET_CONNSTATE_ERROR)
		{
			if(Now - m_aSlots[i].m_Connection.ConnectTime() < time_freq() && NetBan())
			{
				if(NetBan()->BanAddr(ClientAddr(i), 60, "Stressing network") == -1)
					Drop(i, m_aSlots[i].m_Connection.ErrorString());
			}
			else
				Drop(i, m_aSlots[i].m_Connection.ErrorString());
		}
	}

	m_TokenManager.Update();
	m_TokenCache.Update();

	return 0;
}